

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall CheckBox::CheckBox(CheckBox *this)

{
  Vector2f *in_RDI;
  UIComponent *in_stack_ffffffffffffffd0;
  RectangleShape *this_00;
  Text *in_stack_ffffffffffffffe0;
  
  UIComponent::UIComponent(in_stack_ffffffffffffffd0);
  *in_RDI = (Vector2f)&PTR__CheckBox_002bc268;
  in_RDI[1] = (Vector2f)&PTR__CheckBox_002bc2a0;
  this_00 = (RectangleShape *)(in_RDI + 0x17);
  sf::Text::Text(in_stack_ffffffffffffffe0);
  sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xffffffffffffffe4,0.0,0.0);
  sf::RectangleShape::RectangleShape(this_00,in_RDI);
  sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xffffffffffffffdc,0.0,0.0);
  sf::RectangleShape::RectangleShape(this_00,in_RDI);
  sf::Color::Color((Color *)(in_RDI + 0x9b));
  return;
}

Assistant:

CheckBox::CheckBox() {}